

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

_Bool fy_node_uses_single_input_only(fy_node *fyn,fy_input *fyi)

{
  _Bool _Var1;
  fy_input *pfVar2;
  fy_token *pfVar3;
  
  if (fyi == (fy_input *)0x0 || fyn == (fy_node *)0x0) {
    return false;
  }
  switch(fyn->field_0x34 & 3) {
  case 0:
    if ((fyn->field_12).scalar == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_12).scalar)->handle).fyi;
    }
    return pfVar2 == fyi;
  case 1:
    if ((fyn->field_13).sequence_start == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_13).sequence_start)->handle).fyi;
    }
    if (pfVar2 != fyi) {
      return false;
    }
    pfVar3 = (fyn->field_12).scalar;
    if (pfVar3 != (fy_token *)0x0 && pfVar3 != (fy_token *)&fyn->field_12) {
      do {
        _Var1 = fy_node_uses_single_input_only((fy_node *)pfVar3,fyi);
        if (!_Var1) {
          return false;
        }
        pfVar3 = (fy_token *)(pfVar3->node).next;
        if (pfVar3 == (fy_token *)&fyn->field_12) {
          pfVar3 = (fy_token *)0x0;
        }
      } while (pfVar3 != (fy_token *)0x0);
    }
    break;
  case 2:
    if ((fyn->field_13).sequence_start == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_13).sequence_start)->handle).fyi;
    }
    if (pfVar2 != fyi) {
      return false;
    }
    pfVar3 = (fyn->field_12).scalar;
    if (pfVar3 != (fy_token *)0x0 && pfVar3 != (fy_token *)&fyn->field_12) {
      do {
        if ((*(fy_node **)&pfVar3->type != (fy_node *)0x0) &&
           (_Var1 = fy_node_uses_single_input_only(*(fy_node **)&pfVar3->type,fyi), !_Var1)) {
          return false;
        }
        if ((*(fy_node **)&pfVar3->analyze_flags != (fy_node *)0x0) &&
           (_Var1 = fy_node_uses_single_input_only(*(fy_node **)&pfVar3->analyze_flags,fyi), !_Var1)
           ) {
          return false;
        }
        pfVar3 = (fy_token *)(pfVar3->node).next;
        if (pfVar3 == (fy_token *)&fyn->field_12) {
          pfVar3 = (fy_token *)0x0;
        }
      } while (pfVar3 != (fy_token *)0x0);
    }
    break;
  case 3:
    goto LAB_0011d72b;
  }
  if ((fyn->field_14).sequence_end == (fy_token *)0x0) {
    pfVar2 = (fy_input *)0x0;
  }
  else {
    pfVar2 = (((fyn->field_14).sequence_end)->handle).fyi;
  }
  if (pfVar2 != fyi) {
    return false;
  }
LAB_0011d72b:
  return true;
}

Assistant:

bool fy_node_uses_single_input_only(struct fy_node *fyn, struct fy_input *fyi) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !fyi)
        return false;

    switch (fyn->type) {
        case FYNT_SCALAR:
            return fy_token_get_input(fyn->scalar) == fyi;

        case FYNT_SEQUENCE:
            if (fy_token_get_input(fyn->sequence_start) != fyi)
                return false;

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                if (!fy_node_uses_single_input_only(fyni, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->sequence_end) != fyi)
                return false;
            break;

        case FYNT_MAPPING:
            if (fy_token_get_input(fyn->mapping_start) != fyi)
                return false;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                if (fynp->key && !fy_node_uses_single_input_only(fynp->key, fyi))
                    return false;

                if (fynp->value && !fy_node_uses_single_input_only(fynp->value, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->mapping_end) != fyi)
                return false;

            break;
    }

    return true;
}